

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-skt.c
# Opt level: O0

int rops_adoption_bind_raw_skt(lws *wsi,int type,char *vh_prot_name)

{
  lws_udp *plVar1;
  lwsi_state state;
  char *vh_prot_name_local;
  int type_local;
  lws *wsi_local;
  
  if ((((type & 1U) == 0) && ((type & 2U) != 0)) && ((type & 0x1000000U) == 0)) {
    if ((type & 0x10U) != 0) {
      plVar1 = (lws_udp *)lws_realloc((void *)0x0,0x28,"udp struct");
      wsi->udp = plVar1;
    }
    state = LRS_ESTABLISHED;
    if ((type & 4U) != 0) {
      state = LRS_SSL_INIT;
    }
    lws_role_transition(wsi,0,state,&role_ops_raw_skt);
    if (vh_prot_name == (char *)0x0) {
      lws_bind_protocol(wsi,wsi->vhost->protocols + wsi->vhost->raw_protocol_index,
                        "rops_adoption_bind_raw_skt");
    }
    else {
      lws_bind_protocol(wsi,wsi->protocol,"rops_adoption_bind_raw_skt");
    }
    wsi_local._4_4_ = 1;
  }
  else {
    wsi_local._4_4_ = 0;
  }
  return wsi_local._4_4_;
}

Assistant:

static int
rops_adoption_bind_raw_skt(struct lws *wsi, int type, const char *vh_prot_name)
{
	/* no http but socket... must be raw skt */
	if ((type & LWS_ADOPT_HTTP) || !(type & LWS_ADOPT_SOCKET) ||
	    (type & _LWS_ADOPT_FINISH))
		return 0; /* no match */

#if defined(LWS_WITH_UDP)
	if (type & LWS_ADOPT_FLAG_UDP)
		/*
		 * these can be >128 bytes, so just alloc for UDP
		 */
		wsi->udp = lws_malloc(sizeof(*wsi->udp), "udp struct");
#endif

	lws_role_transition(wsi, 0, (type & LWS_ADOPT_ALLOW_SSL) ? LRS_SSL_INIT :
				LRS_ESTABLISHED, &role_ops_raw_skt);

	if (vh_prot_name)
		lws_bind_protocol(wsi, wsi->protocol, __func__);
	else
		/* this is the only time he will transition */
		lws_bind_protocol(wsi,
			&wsi->vhost->protocols[wsi->vhost->raw_protocol_index],
			__func__);

	return 1; /* bound */
}